

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void SparseKeygenRecurse<Blob<1536>,unsigned_int>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<1536> *k,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes)

{
  uint h;
  value_type_conflict2 local_34;
  
  while (start < 0x600) {
    flipbit(k,0xc0,start);
    if (bitsleft == 1 || inclusive) {
      (*hash)(k,0xc0,0,&local_34);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(hashes,&local_34);
    }
    if (1 < bitsleft) {
      SparseKeygenRecurse<Blob<1536>,unsigned_int>(hash,start + 1U,bitsleft + -1,inclusive,k,hashes)
      ;
    }
    flipbit(k,0xc0,start);
    start = start + 1U;
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}